

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

void __thiscall wasm::GlobalTypeRewriter::update(GlobalTypeRewriter *this)

{
  pointer *this_00;
  undefined1 auVar1 [8];
  uint uVar2;
  bool bVar3;
  uint *puVar4;
  size_t sVar5;
  Type *pTVar6;
  Struct *other;
  reference pFVar7;
  Type TVar8;
  undefined4 extraout_var;
  HeapType *pHVar9;
  pointer ppVar10;
  Fatal *pFVar11;
  reference ppVar12;
  type *ptVar13;
  type *ptVar14;
  const_reference pvVar15;
  mapped_type *pmVar16;
  reference __in;
  type *__x;
  pointer ppVar17;
  mapped_type *this_01;
  Signature SVar18;
  Iterator IVar19;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar20;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar21;
  Entry EVar22;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_628;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_620;
  iterator it_1;
  type *new_;
  type *old;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_600;
  iterator __end1_3;
  iterator __begin1_3;
  TypeMap *__range1_3;
  type *index;
  type *type_2;
  undefined8 uStack_5d0;
  _Self local_5c8;
  iterator __end1_2;
  iterator __begin1_2;
  InsertOrderedMap<wasm::HeapType,_unsigned_int> *__range1_2;
  TypeMap oldToNewTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *newTypes;
  Error *local_3e8;
  Error *err;
  BuildResult buildResults;
  Entry local_3b8;
  Entry local_3a8;
  uintptr_t local_398;
  Entry local_390;
  _Self local_380;
  _Self local_378;
  iterator it;
  _Storage<wasm::HeapType,_true> local_368;
  optional<wasm::HeapType> super;
  Array local_348;
  uintptr_t local_338;
  uintptr_t local_330;
  uintptr_t local_328;
  undefined1 local_320 [8];
  Array newArray;
  Array array;
  Field *field;
  iterator __end4;
  iterator __begin4;
  FieldList *__range4;
  Struct newStruct;
  Struct struct_;
  Tuple local_258;
  uintptr_t local_240;
  Tuple local_238;
  Type local_220;
  undefined1 auStack_218 [8];
  Signature newSig;
  value_type local_200;
  uintptr_t local_1f8;
  Type t_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  Type *__range3_1;
  value_type local_1c0;
  uintptr_t local_1b8;
  Type t;
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  TypeList newResults;
  TypeList newParams;
  Signature sig;
  type *_;
  type *type_1;
  undefined8 uStack_130;
  _Self local_128;
  iterator __end1_1;
  iterator __begin1_1;
  InsertOrderedMap<wasm::HeapType,_unsigned_int> *__range1_1;
  HeapType local_108;
  HeapType type;
  Iterator __end1;
  Iterator __begin1;
  SupertypesFirst local_e0;
  SupertypesFirst *local_38;
  SupertypesFirst *__range1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> privateTypes;
  Index i;
  GlobalTypeRewriter *this_local;
  
  privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  wasm::ModuleUtils::getPrivateHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1,this->wasm);
  update()::SupertypesFirst::SupertypesFirst(wasm::GlobalTypeRewriter&,std::vector<wasm::
  HeapType,std::allocator<wasm::HeapType>_>_const__
            (&local_e0,this,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1);
  local_38 = &local_e0;
  __end1 = TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
           ::begin((TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
                    *)local_38);
  type.id = (uintptr_t)
            TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
            ::end((TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
                   *)local_38);
  while (bVar3 = TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
                 ::Iterator::operator!=(&__end1,(Iterator *)&type), bVar3) {
    local_108 = TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
                ::Iterator::operator*(&__end1);
    uVar2 = privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._4_4_;
    privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    puVar4 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::operator[]
                       (&this->typeIndices,&local_108);
    *puVar4 = uVar2;
    TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>::
    Iterator::operator++(&__end1);
  }
  update::SupertypesFirst::~SupertypesFirst(&local_e0);
  sVar5 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::size(&this->typeIndices);
  if (sVar5 != 0) {
    sVar5 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::size(&this->typeIndices);
    TypeBuilder::grow(&this->typeBuilder,sVar5);
    sVar5 = TypeBuilder::size(&this->typeBuilder);
    TypeBuilder::createRecGroup(&this->typeBuilder,0,sVar5);
    privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    __end1_1 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::begin(&this->typeIndices);
    local_128._M_node =
         (_List_node_base *)InsertOrderedMap<wasm::HeapType,_unsigned_int>::end(&this->typeIndices);
    while( true ) {
      bVar3 = std::operator!=(&__end1_1,&local_128);
      if (!bVar3) break;
      ppVar12 = std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator*
                          (&__end1_1);
      type_1 = (type *)(ppVar12->first).id;
      uStack_130._0_4_ = ppVar12->second;
      uStack_130._4_4_ = *(undefined4 *)&ppVar12->field_0xc;
      ptVar13 = std::get<0ul,wasm::HeapType_const,unsigned_int>
                          ((pair<const_wasm::HeapType,_unsigned_int> *)&type_1);
      sig.results.id =
           (uintptr_t)
           std::get<1ul,wasm::HeapType_const,unsigned_int>
                     ((pair<const_wasm::HeapType,_unsigned_int> *)&type_1);
      bVar3 = HeapType::isSignature(ptVar13);
      if (bVar3) {
        SVar18 = HeapType::getSignature(ptVar13);
        sig.params = SVar18.results.id;
        newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)SVar18.params.id;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                   &newResults.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
        this_00 = &newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        IVar19 = wasm::Type::begin((Type *)this_00);
        __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)IVar19.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
        PVar20 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)this_00);
        while( true ) {
          __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)PVar20.index;
          t.id = (uintptr_t)PVar20.parent;
          bVar3 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                            ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                             &__end3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *
                                    )&t);
          if (!bVar3) break;
          pTVar6 = wasm::Type::Iterator::operator*
                             ((Iterator *)
                              &__end3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
          local_1b8 = pTVar6->id;
          local_1c0.id = (uintptr_t)getTempType(this,local_1b8);
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     &newResults.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,&local_1c0);
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
          PVar20.index = (size_t)__end3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent;
          PVar20.parent = (Type *)t.id;
        }
        IVar19 = wasm::Type::begin(&sig.params);
        __end3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)IVar19.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
        PVar21 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end(&sig.params);
        while( true ) {
          __end3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)PVar21.index;
          t_1.id = (uintptr_t)PVar21.parent;
          bVar3 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                            ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                             &__end3_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *
                                    )&t_1);
          if (!bVar3) break;
          pTVar6 = wasm::Type::Iterator::operator*
                             ((Iterator *)
                              &__end3_1.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
          newSig.results.id = pTVar6->id;
          local_1f8 = newSig.results.id;
          local_200.id = (uintptr_t)getTempType(this,newSig.results);
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3,&local_200);
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
          PVar21.index = (size_t)__end3_1.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent;
          PVar21.parent = (Type *)t_1.id;
        }
        Tuple::Tuple(&local_238,
                     (TypeList *)
                     &newResults.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
        local_220 = TypeBuilder::getTempTupleType(&this->typeBuilder,&local_238);
        Tuple::Tuple(&local_258,(TypeList *)&__range3);
        local_240 = (uintptr_t)TypeBuilder::getTempTupleType(&this->typeBuilder,&local_258);
        Signature::Signature((Signature *)auStack_218,local_220,(Type)local_240);
        Tuple::~Tuple(&local_258);
        Tuple::~Tuple(&local_238);
        (*this->_vptr_GlobalTypeRewriter[4])(this,ptVar13->id,auStack_218);
        TVar8 = newSig.params;
        auVar1 = auStack_218;
        EVar22 = TypeBuilder::operator[]
                           (&this->typeBuilder,
                            (ulong)privateTypes.
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)EVar22.builder;
        SVar18.results.id = TVar8.id;
        SVar18.params.id = (uintptr_t)auVar1;
        TypeBuilder::Entry::operator=
                  ((Entry *)&struct_.fields.
                             super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,SVar18);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                   &newResults.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        bVar3 = HeapType::isStruct(ptVar13);
        if (bVar3) {
          other = HeapType::getStruct(ptVar13);
          Struct::Struct((Struct *)
                         &newStruct.fields.
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,other);
          Struct::Struct((Struct *)&__range4,
                         (Struct *)
                         &newStruct.fields.
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
          __end4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin
                             ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&__range4);
          field = (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end
                                     ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&__range4
                                     );
          while( true ) {
            bVar3 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                                        *)&field);
            if (!bVar3) break;
            pFVar7 = __gnu_cxx::
                     __normal_iterator<wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                     ::operator*(&__end4);
            TVar8 = getTempType(this,(pFVar7->type).id);
            (pFVar7->type).id = TVar8.id;
            __gnu_cxx::
            __normal_iterator<wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
            ::operator++(&__end4);
          }
          (*this->_vptr_GlobalTypeRewriter[2])(this,ptVar13->id,&__range4);
          EVar22 = TypeBuilder::operator[]
                             (&this->typeBuilder,
                              (ulong)privateTypes.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          array.element._8_8_ = EVar22.builder;
          TypeBuilder::Entry::operator=((Entry *)&array.element.packedType,(Struct *)&__range4);
          Struct::~Struct((Struct *)&__range4);
          Struct::~Struct((Struct *)
                          &newStruct.fields.
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        }
        else {
          bVar3 = HeapType::isArray(ptVar13);
          if (!bVar3) {
            handle_unreachable("bad type",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                               ,0x67);
          }
          HeapType::getArray((HeapType *)&newArray.element.packedType);
          Array::Array((Array *)local_320,(Array *)&newArray.element.packedType);
          local_330 = (uintptr_t)local_320;
          local_328 = (uintptr_t)getTempType(this,(Type)local_320);
          local_338 = ptVar13->id;
          local_320 = (undefined1  [8])local_328;
          (*this->_vptr_GlobalTypeRewriter[3])(this,local_338,local_320);
          Array::Array(&local_348,(Array *)local_320);
          EVar22 = TypeBuilder::operator[]
                             (&this->typeBuilder,
                              (ulong)privateTypes.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = EVar22.builder;
          TypeBuilder::Entry::operator=
                    ((Entry *)&super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._M_engaged,&local_348);
        }
      }
      it._M_node = (_List_node_base *)ptVar13->id;
      local_368._0_4_ = (*this->_vptr_GlobalTypeRewriter[5])(this,it._M_node);
      local_368._M_value.id._4_4_ = extraout_var;
      bVar3 = std::optional::operator_cast_to_bool((optional *)&local_368._M_value);
      if (bVar3) {
        pHVar9 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)&local_368._M_value);
        local_378._M_node =
             (_List_node_base *)
             InsertOrderedMap<wasm::HeapType,_unsigned_int>::find(&this->typeIndices,pHVar9);
        local_380._M_node =
             (_List_node_base *)
             InsertOrderedMap<wasm::HeapType,_unsigned_int>::end(&this->typeIndices);
        bVar3 = std::operator!=(&local_378,&local_380);
        if (bVar3) {
          ppVar10 = std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator->
                              (&local_378);
          if (privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <= ppVar10->second) {
            __assert_fail("it->second < i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                          ,0x6d,"void wasm::GlobalTypeRewriter::update()");
          }
          EVar22 = TypeBuilder::operator[]
                             (&this->typeBuilder,
                              (ulong)privateTypes.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          local_390 = EVar22;
          ppVar10 = std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator->
                              (&local_378);
          EVar22 = TypeBuilder::operator[](&this->typeBuilder,(ulong)ppVar10->second);
          local_3a8 = EVar22;
          local_398 = (uintptr_t)TypeBuilder::Entry::operator_cast_to_HeapType(&local_3a8);
          TypeBuilder::Entry::subTypeOf(&local_390,(HeapType)local_398);
        }
        else {
          EVar22 = TypeBuilder::operator[]
                             (&this->typeBuilder,
                              (ulong)privateTypes.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          local_3b8 = EVar22;
          pHVar9 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&local_368._M_value);
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
               = pHVar9->id;
          TypeBuilder::Entry::subTypeOf
                    (&local_3b8,
                     (HeapType)
                     buildResults.
                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .
                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     ._24_8_);
        }
      }
      privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator++(&__end1_1);
    }
    TypeBuilder::build((BuildResult *)&err,&this->typeBuilder);
    local_3e8 = TypeBuilder::BuildResult::getError((BuildResult *)&err);
    if (local_3e8 != (Error *)0x0) {
      Fatal::Fatal((Fatal *)&newTypes);
      pFVar11 = Fatal::operator<<((Fatal *)&newTypes,
                                  (char (*) [42])"Internal GlobalTypeRewriter build error: ");
      pFVar11 = Fatal::operator<<(pFVar11,&local_3e8->reason);
      pFVar11 = Fatal::operator<<(pFVar11,(char (*) [11])0x214aa13);
      Fatal::operator<<(pFVar11,&local_3e8->index);
      Fatal::~Fatal((Fatal *)&newTypes);
    }
    oldToNewTypes._M_h._M_single_bucket =
         (__node_base_ptr)TypeBuilder::BuildResult::operator*((BuildResult *)&err);
    std::
    unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
    ::unordered_map((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                     *)&__range1_2);
    __end1_2 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::begin(&this->typeIndices);
    local_5c8._M_node =
         (_List_node_base *)InsertOrderedMap<wasm::HeapType,_unsigned_int>::end(&this->typeIndices);
    while( true ) {
      bVar3 = std::operator!=(&__end1_2,&local_5c8);
      if (!bVar3) break;
      ppVar12 = std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator*
                          (&__end1_2);
      type_2 = (type *)(ppVar12->first).id;
      uStack_5d0._0_4_ = ppVar12->second;
      uStack_5d0._4_4_ = *(undefined4 *)&ppVar12->field_0xc;
      ptVar13 = std::get<0ul,wasm::HeapType_const,unsigned_int>
                          ((pair<const_wasm::HeapType,_unsigned_int> *)&type_2);
      ptVar14 = std::get<1ul,wasm::HeapType_const,unsigned_int>
                          ((pair<const_wasm::HeapType,_unsigned_int> *)&type_2);
      pvVar15 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                           oldToNewTypes._M_h._M_single_bucket,(ulong)*ptVar14);
      pmVar16 = std::
                unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                              *)&__range1_2,ptVar13);
      pmVar16->id = pvVar15->id;
      std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>::operator++(&__end1_2);
    }
    __end1_3 = std::
               unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
               ::begin((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                        *)&__range1_2);
    local_600._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::end((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                *)&__range1_2);
    while( true ) {
      bVar3 = std::__detail::operator!=
                        (&__end1_3.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                         ,&local_600);
      if (!bVar3) break;
      __in = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::operator*
                       (&__end1_3);
      __x = std::get<0ul,wasm::HeapType_const,wasm::HeapType>(__in);
      it_1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>._M_cur
           = (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)
             std::get<1ul,wasm::HeapType_const,wasm::HeapType>(__in);
      local_620._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
           ::find(&this->wasm->typeNames,__x);
      local_628._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
           ::end(&this->wasm->typeNames);
      bVar3 = std::__detail::operator!=(&local_620,&local_628);
      if (bVar3) {
        ppVar17 = std::__detail::
                  _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
                  operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                              *)&local_620);
        this_01 = std::
                  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                  ::operator[](&this->wasm->typeNames,
                               (key_type *)
                               it_1.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                               ._M_cur);
        TypeNames::operator=(this_01,&ppVar17->second);
      }
      std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
      operator++(&__end1_3);
    }
    mapTypes(this,(TypeMap *)&__range1_2);
    std::
    unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
    ::~unordered_map((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                      *)&__range1_2);
    TypeBuilder::BuildResult::~BuildResult((BuildResult *)&err);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1);
  return;
}

Assistant:

void GlobalTypeRewriter::update() {
  // Find the heap types that are not publicly observable. Even in a closed
  // world scenario, don't modify public types because we assume that they may
  // be reflected on or used for linking. Figure out where each private type
  // will be located in the builder. Sort the private types so that supertypes
  // come before their subtypes.
  Index i = 0;
  auto privateTypes = ModuleUtils::getPrivateHeapTypes(wasm);

  // Topological sort to have supertypes first, but we have to account for the
  // fact that we may be replacing the supertypes to get the order correct.
  struct SupertypesFirst
    : HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst> {
    GlobalTypeRewriter& parent;

    SupertypesFirst(GlobalTypeRewriter& parent,
                    const std::vector<HeapType>& types)
      : SupertypesFirstBase(types), parent(parent) {}
    std::optional<HeapType> getSuperType(HeapType type) {
      return parent.getSuperType(type);
    }
  };

  for (auto type : SupertypesFirst(*this, privateTypes)) {
    typeIndices[type] = i++;
  }

  if (typeIndices.size() == 0) {
    return;
  }
  typeBuilder.grow(typeIndices.size());

  // All the input types are distinct, so we need to make sure the output types
  // are distinct as well. Further, the new types may have more recursions than
  // the original types, so the old recursion groups may not be sufficient any
  // more. Both of these problems are solved by putting all the new types into a
  // single large recursion group.
  typeBuilder.createRecGroup(0, typeBuilder.size());

  // Create the temporary heap types.
  i = 0;
  for (auto [type, _] : typeIndices) {
    if (type.isSignature()) {
      auto sig = type.getSignature();
      TypeList newParams, newResults;
      for (auto t : sig.params) {
        newParams.push_back(getTempType(t));
      }
      for (auto t : sig.results) {
        newResults.push_back(getTempType(t));
      }
      Signature newSig(typeBuilder.getTempTupleType(newParams),
                       typeBuilder.getTempTupleType(newResults));
      modifySignature(type, newSig);
      typeBuilder[i] = newSig;
    } else if (type.isStruct()) {
      auto struct_ = type.getStruct();
      // Start with a copy to get mutability/packing/etc.
      auto newStruct = struct_;
      for (auto& field : newStruct.fields) {
        field.type = getTempType(field.type);
      }
      modifyStruct(type, newStruct);
      typeBuilder[i] = newStruct;
    } else if (type.isArray()) {
      auto array = type.getArray();
      // Start with a copy to get mutability/packing/etc.
      auto newArray = array;
      newArray.element.type = getTempType(newArray.element.type);
      modifyArray(type, newArray);
      typeBuilder[i] = newArray;
    } else {
      WASM_UNREACHABLE("bad type");
    }

    // Apply a super, if there is one
    if (auto super = getSuperType(type)) {
      if (auto it = typeIndices.find(*super); it != typeIndices.end()) {
        assert(it->second < i);
        typeBuilder[i].subTypeOf(typeBuilder[it->second]);
      } else {
        typeBuilder[i].subTypeOf(*super);
      }
    }
    i++;
  }

  auto buildResults = typeBuilder.build();
#ifndef NDEBUG
  if (auto* err = buildResults.getError()) {
    Fatal() << "Internal GlobalTypeRewriter build error: " << err->reason
            << " at index " << err->index;
  }
#endif
  auto& newTypes = *buildResults;

  // Map the old types to the new ones.
  TypeMap oldToNewTypes;
  for (auto [type, index] : typeIndices) {
    oldToNewTypes[type] = newTypes[index];
  }

  // Update type names (doing it before mapTypes can help debugging there, but
  // has no other effect; mapTypes does not look at type names).
  for (auto& [old, new_] : oldToNewTypes) {
    if (auto it = wasm.typeNames.find(old); it != wasm.typeNames.end()) {
      wasm.typeNames[new_] = it->second;
    }
  }

  mapTypes(oldToNewTypes);
}